

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonwriter.cpp
# Opt level: O3

void arrayContentToJson(QCborContainerPrivate *a,QByteArray *json,int indent,bool compact)

{
  char *s;
  long lVar1;
  long in_FS_OFFSET;
  QByteArray local_68;
  QCborValue local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((a != (QCborContainerPrivate *)0x0) && ((a->elements).d.size != 0)) {
    local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray(&local_68,(long)(indent * 4),' ');
    s = ",\n";
    if (compact) {
      s = ",";
    }
    lVar1 = 1;
    while( true ) {
      QByteArray::append(json,&local_68);
      QCborContainerPrivate::valueAt(&local_50,a,lVar1 + -1);
      valueContentToJson(&local_50,json,indent,compact);
      if (local_50.container != (QCborContainerPrivate *)0x0) {
        QCborValue::dispose(&local_50);
      }
      if (lVar1 == (a->elements).d.size) break;
      QByteArray::append(json,s,-1);
      lVar1 = lVar1 + 1;
    }
    if (!compact) {
      QByteArray::append(json,'\n');
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void arrayContentToJson(const QCborContainerPrivate *a, QByteArray &json, int indent, bool compact)
{
    if (!a || a->elements.empty())
        return;

    QByteArray indentString(4*indent, ' ');

    qsizetype i = 0;
    while (true) {
        json += indentString;
        valueContentToJson(a->valueAt(i), json, indent, compact);

        if (++i == a->elements.size()) {
            if (!compact)
                json += '\n';
            break;
        }

        json += compact ? "," : ",\n";
    }
}